

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

size_t cs_disasm(csh ud,uint8_t *buffer,size_t size,uint64_t offset,size_t count,cs_insn **insn)

{
  byte bVar1;
  void *pvVar2;
  undefined1 local_5f4 [8];
  SStream ss;
  size_t next_offset;
  uint cache_size;
  uint8_t *buffer_org;
  size_t size_org;
  uint64_t offset_org;
  size_t skipdata_bytes;
  void *tmp;
  size_t sStack_3b0;
  _Bool r;
  size_t total_size;
  void *total;
  cs_insn *insn_cache;
  ulong uStack_390;
  uint f;
  size_t i;
  size_t c;
  undefined1 local_378 [6];
  uint16_t insn_size;
  MCInst mci;
  cs_struct *handle;
  cs_insn **insn_local;
  size_t count_local;
  uint64_t offset_local;
  size_t size_local;
  uint8_t *buffer_local;
  csh ud_local;
  
  i = 0;
  insn_cache._4_4_ = 0;
  next_offset._4_4_ = 0x20;
  if (ud == 0) {
    ud_local = 0;
  }
  else {
    *(undefined4 *)(ud + 0x58) = 0;
    if (*(int *)ud == 0) {
      *(undefined4 *)(ud + 100) = 0;
    }
    if ((count != 0) && (count < 0x21)) {
      next_offset._4_4_ = (uint)count;
    }
    sStack_3b0 = (ulong)next_offset._4_4_ * 0xf0;
    mci._808_8_ = ud;
    total_size = (size_t)(*cs_mem_malloc)(sStack_3b0);
    total = (void *)total_size;
    count_local = offset;
    offset_local = size;
    size_local = (size_t)buffer;
    if ((void *)total_size == (void *)0x0) {
      *(undefined4 *)(mci._808_8_ + 0x58) = 1;
      ud_local = 0;
    }
    else {
      for (; offset_local != 0; offset_local = offset_local - ss._508_8_) {
        MCInst_Init((MCInst *)local_378);
        mci.address._0_1_ = mci.x86opsize;
        mci.address._1_1_ = mci.x86_prefix[0];
        mci.address._2_1_ = mci.x86_prefix[1];
        mci.address._3_1_ = mci.x86_prefix[2];
        mci.address._4_1_ = mci.x86_prefix[3];
        mci.address._5_1_ = mci.imm_size;
        mci.address._6_1_ = mci.writeback;
        mci.address._7_1_ = mci._815_1_;
        mci.flat_insn = (cs_insn *)count_local;
        if (*(int *)(mci._808_8_ + 0x68) == 0) {
          *(undefined8 *)((long)total + 0xe8) = 0;
        }
        else {
          pvVar2 = (*cs_mem_malloc)(0x5f8);
          *(void **)((long)total + 0xe8) = pvVar2;
        }
        mci.Operands[0x2f].field_2 = (anon_union_8_3_2f11d3b5_for_MCOperand_3)total;
        *(size_t *)((long)total + 8) = count_local;
        bVar1 = (**(code **)(mci._808_8_ + 0x18))
                          (ud,size_local,offset_local,local_378,(long)&c + 6,count_local,
                           *(undefined8 *)(mci._808_8_ + 0x20));
        if ((bVar1 & 1) == 0) {
          if (*(int *)(mci._808_8_ + 0x68) != 0) {
            (*cs_mem_free)(*(void **)((long)total + 0xe8));
          }
          if (((*(byte *)(mci._808_8_ + 0x88) & 1) == 0) ||
             (offset_local < *(byte *)(mci._808_8_ + 0x89))) break;
          if (*(long *)(mci._808_8_ + 0x98) == 0) {
            offset_org = (uint64_t)*(byte *)(mci._808_8_ + 0x89);
          }
          else {
            offset_org = (**(code **)(mci._808_8_ + 0x98))
                                   (buffer,size,count_local - offset,
                                    *(undefined8 *)(mci._808_8_ + 0xa0));
            if ((offset_local < offset_org) || (offset_org == 0)) break;
          }
          *(undefined4 *)total = 0;
          *(size_t *)((long)total + 8) = count_local;
          *(short *)((long)total + 0x10) = (short)offset_org;
          memcpy((void *)((long)total + 0x12),(void *)size_local,offset_org);
          strncpy((char *)((long)total + 0x22),*(char **)(mci._808_8_ + 0x90),0x1f);
          skipdata_opstr((char *)((long)total + 0x42),(uint8_t *)size_local,offset_org);
          *(undefined8 *)((long)total + 0xe8) = 0;
          ss.buffer[0x1fc] = (undefined1)offset_org;
          ss.buffer[0x1fd] = offset_org._1_1_;
          ss.buffer[0x1fe] = offset_org._2_1_;
          ss.buffer[0x1ff] = offset_org._3_1_;
          ss.index = offset_org._4_4_;
        }
        else {
          SStream_Init((SStream *)local_5f4);
          *(ushort *)(mci.Operands[0x2f].field_2.ImmVal + 0x10) = c._6_2_;
          (**(code **)(mci._808_8_ + 0x48))(mci._808_8_,total,mci.OpcodePub);
          (**(code **)(mci._808_8_ + 8))(local_378,local_5f4,*(undefined8 *)(mci._808_8_ + 0x10));
          fill_insn((cs_struct *)mci._808_8_,(cs_insn *)total,local_5f4,(MCInst *)local_378,
                    *(PostPrinter_t *)(mci._808_8_ + 0x50),(uint8_t *)size_local);
          ss._508_8_ = ZEXT28(c._6_2_);
        }
        insn_cache._4_4_ = insn_cache._4_4_ + 1;
        i = i + 1;
        if ((count != 0) && (i == count)) break;
        if (insn_cache._4_4_ == next_offset._4_4_) {
          next_offset._4_4_ = (next_offset._4_4_ << 3) / 5;
          sStack_3b0 = (ulong)next_offset._4_4_ * 0xf0 + sStack_3b0;
          pvVar2 = (*cs_mem_realloc)((void *)total_size,sStack_3b0);
          if (pvVar2 == (void *)0x0) {
            if (*(int *)(mci._808_8_ + 0x68) != 0) {
              total = (void *)total_size;
              for (uStack_390 = 0; uStack_390 < i; uStack_390 = uStack_390 + 1) {
                (*cs_mem_free)(*(void **)((long)total + 0xe8));
                total = (void *)((long)total + 0xf0);
              }
            }
            (*cs_mem_free)((void *)total_size);
            *insn = (cs_insn *)0x0;
            *(undefined4 *)(mci._808_8_ + 0x58) = 1;
            return 0;
          }
          total = (void *)((long)pvVar2 + i * 0xf0);
          insn_cache._4_4_ = 0;
          total_size = (size_t)pvVar2;
        }
        else {
          total = (void *)((long)total + 0xf0);
        }
        size_local = ss._508_8_ + size_local;
        count_local = ss._508_8_ + count_local;
      }
      if (i == 0) {
        (*cs_mem_free)((void *)total_size);
        total_size = 0;
        pvVar2 = (void *)total_size;
      }
      else {
        pvVar2 = (void *)total_size;
        if ((insn_cache._4_4_ != next_offset._4_4_) &&
           (pvVar2 = (*cs_mem_realloc)((void *)total_size,
                                       sStack_3b0 +
                                       (ulong)(next_offset._4_4_ - insn_cache._4_4_) * -0xf0),
           pvVar2 == (void *)0x0)) {
          if (*(int *)(mci._808_8_ + 0x68) != 0) {
            total = (void *)total_size;
            for (uStack_390 = 0; uStack_390 < i; uStack_390 = uStack_390 + 1) {
              (*cs_mem_free)(*(void **)((long)total + 0xe8));
              total = (void *)((long)total + 0xf0);
            }
          }
          (*cs_mem_free)((void *)total_size);
          *insn = (cs_insn *)0x0;
          *(undefined4 *)(mci._808_8_ + 0x58) = 1;
          return 0;
        }
      }
      total_size = (size_t)pvVar2;
      *insn = (cs_insn *)total_size;
      ud_local = i;
    }
  }
  return ud_local;
}

Assistant:

CAPSTONE_API cs_disasm(csh ud, const uint8_t *buffer, size_t size, uint64_t offset, size_t count, cs_insn **insn)
{
	struct cs_struct *handle;
	MCInst mci;
	uint16_t insn_size;
	size_t c = 0, i;
	unsigned int f = 0;	// index of the next instruction in the cache
	cs_insn *insn_cache;	// cache contains disassembled instructions
	void *total = NULL;
	size_t total_size = 0;	// total size of output buffer containing all insns
	bool r;
	void *tmp;
	size_t skipdata_bytes;
	uint64_t offset_org; // save all the original info of the buffer
	size_t size_org;
	const uint8_t *buffer_org;
	unsigned int cache_size = INSN_CACHE_SIZE;
	size_t next_offset;

	handle = (struct cs_struct *)(uintptr_t)ud;
	if (!handle) {
		// FIXME: how to handle this case:
		// handle->errnum = CS_ERR_HANDLE;
		return 0;
	}

	handle->errnum = CS_ERR_OK;

	// reset IT block of ARM structure
	if (handle->arch == CS_ARCH_ARM)
		handle->ITBlock.size = 0;

#ifdef CAPSTONE_USE_SYS_DYN_MEM
	if (count > 0 && count <= INSN_CACHE_SIZE)
		cache_size = (unsigned int) count;
#endif

	// save the original offset for SKIPDATA
	buffer_org = buffer;
	offset_org = offset;
	size_org = size;

	total_size = sizeof(cs_insn) * cache_size;
	total = cs_mem_malloc(total_size);
	if (total == NULL) {
		// insufficient memory
		handle->errnum = CS_ERR_MEM;
		return 0;
	}

	insn_cache = total;

	while (size > 0) {
		MCInst_Init(&mci);
		mci.csh = handle;

		// relative branches need to know the address & size of current insn
		mci.address = offset;

		if (handle->detail) {
			// allocate memory for @detail pointer
			insn_cache->detail = cs_mem_malloc(sizeof(cs_detail));
		} else {
			insn_cache->detail = NULL;
		}

		// save all the information for non-detailed mode
		mci.flat_insn = insn_cache;
		mci.flat_insn->address = offset;
#ifdef CAPSTONE_DIET
		// zero out mnemonic & op_str
		mci.flat_insn->mnemonic[0] = '\0';
		mci.flat_insn->op_str[0] = '\0';
#endif

		r = handle->disasm(ud, buffer, size, &mci, &insn_size, offset, handle->getinsn_info);
		if (r) {
			SStream ss;
			SStream_Init(&ss);

			mci.flat_insn->size = insn_size;

			// map internal instruction opcode to public insn ID
			handle->insn_id(handle, insn_cache, mci.Opcode);

			handle->printer(&mci, &ss, handle->printer_info);

			fill_insn(handle, insn_cache, ss.buffer, &mci, handle->post_printer, buffer);

			next_offset = insn_size;
		} else	{
			// encounter a broken instruction

			// free memory of @detail pointer
			if (handle->detail) {
				cs_mem_free(insn_cache->detail);
			}

			// if there is no request to skip data, or remaining data is too small,
			// then bail out
			if (!handle->skipdata || handle->skipdata_size > size)
				break;

			if (handle->skipdata_setup.callback) {
				skipdata_bytes = handle->skipdata_setup.callback(buffer_org, size_org,
						(size_t)(offset - offset_org), handle->skipdata_setup.user_data);
				if (skipdata_bytes > size)
					// remaining data is not enough
					break;

				if (!skipdata_bytes)
					// user requested not to skip data, so bail out
					break;
			} else
				skipdata_bytes = handle->skipdata_size;

			// we have to skip some amount of data, depending on arch & mode
			insn_cache->id = 0;	// invalid ID for this "data" instruction
			insn_cache->address = offset;
			insn_cache->size = (uint16_t)skipdata_bytes;
			memcpy(insn_cache->bytes, buffer, skipdata_bytes);
			strncpy(insn_cache->mnemonic, handle->skipdata_setup.mnemonic,
					sizeof(insn_cache->mnemonic) - 1);
			skipdata_opstr(insn_cache->op_str, buffer, skipdata_bytes);
			insn_cache->detail = NULL;

			next_offset = skipdata_bytes;
		}

		// one more instruction entering the cache
		f++;

		// one more instruction disassembled
		c++;
		if (count > 0 && c == count)
			// already got requested number of instructions
			break;

		if (f == cache_size) {
			// full cache, so expand the cache to contain incoming insns
			cache_size = cache_size * 8 / 5; // * 1.6 ~ golden ratio
			total_size += (sizeof(cs_insn) * cache_size);
			tmp = cs_mem_realloc(total, total_size);
			if (tmp == NULL) {	// insufficient memory
				if (handle->detail) {
					insn_cache = (cs_insn *)total;
					for (i = 0; i < c; i++, insn_cache++)
						cs_mem_free(insn_cache->detail);
				}

				cs_mem_free(total);
				*insn = NULL;
				handle->errnum = CS_ERR_MEM;
				return 0;
			}

			total = tmp;
			// continue to fill in the cache after the last instruction
			insn_cache = (cs_insn *)((char *)total + sizeof(cs_insn) * c);

			// reset f back to 0, so we fill in the cache from begining
			f = 0;
		} else
			insn_cache++;

		buffer += next_offset;
		size -= next_offset;
		offset += next_offset;
	}

	if (!c) {
		// we did not disassemble any instruction
		cs_mem_free(total);
		total = NULL;
	} else if (f != cache_size) {
		// total did not fully use the last cache, so downsize it
		tmp = cs_mem_realloc(total, total_size - (cache_size - f) * sizeof(*insn_cache));
		if (tmp == NULL) {	// insufficient memory
			// free all detail pointers
			if (handle->detail) {
				insn_cache = (cs_insn *)total;
				for (i = 0; i < c; i++, insn_cache++)
					cs_mem_free(insn_cache->detail);
			}

			cs_mem_free(total);
			*insn = NULL;

			handle->errnum = CS_ERR_MEM;
			return 0;
		}

		total = tmp;
	}

	*insn = total;

	return c;
}